

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenPackForStructField
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_prefix_ptr,
          string *code_ptr)

{
  IdlNamer *pIVar1;
  string *this_00;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string field_field;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string struct_type;
  string field_method;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&field_method,pIVar1,field);
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&struct_type,pIVar1,struct_def);
  if (((field->value).type.struct_def)->fixed == true) {
    GenIndents_abi_cxx11_(&local_170,this,2);
    std::operator+(&local_150,&local_170,"if self.");
    std::operator+(&local_130,&local_150,&field_field);
    std::operator+(&local_110,&local_130," is not None:");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    GenIndents_abi_cxx11_(&local_f0,this,3);
    std::operator+(&local_170,&local_f0,&field_field);
    std::operator+(&local_150,&local_170," = self.");
    std::operator+(&local_130,&local_150,&field_field);
    std::operator+(&local_110,&local_130,".Pack(builder)");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    this_00 = &local_f0;
  }
  else {
    GenIndents_abi_cxx11_(&local_170,this,2);
    std::operator+(&local_150,&local_170,"if self.");
    std::operator+(&local_130,&local_150,&field_field);
    std::operator+(&local_110,&local_130," is not None:");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    GenIndents_abi_cxx11_(&local_f0,this,3);
    std::operator+(&local_170,&local_f0,&field_field);
    std::operator+(&local_150,&local_170," = self.");
    std::operator+(&local_130,&local_150,&field_field);
    std::operator+(&local_110,&local_130,".Pack(builder)");
    std::__cxx11::string::append((string *)code_prefix_ptr);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_f0);
    GenIndents_abi_cxx11_(&local_170,this,2);
    std::operator+(&local_150,&local_170,"if self.");
    std::operator+(&local_130,&local_150,&field_field);
    std::operator+(&local_110,&local_130," is not None:");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    this_00 = &local_170;
  }
  std::__cxx11::string::~string((string *)this_00);
  GenIndents_abi_cxx11_(&local_b0,this,3);
  std::operator+(&local_90,&local_b0,&struct_type);
  std::operator+(&local_f0,&local_90,"Add");
  std::operator+(&local_170,&local_f0,&field_method);
  std::operator+(&local_150,&local_170,"(builder, ");
  std::operator+(&local_130,&local_150,&field_field);
  std::operator+(&local_110,&local_130,")");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&struct_type);
  std::__cxx11::string::~string((string *)&field_method);
  std::__cxx11::string::~string((string *)&field_field);
  return;
}

Assistant:

void GenPackForStructField(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_prefix_ptr,
                             std::string *code_ptr) const {
    auto &code_prefix = *code_prefix_ptr;
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_type = namer_.Type(struct_def);

    if (field.value.type.struct_def->fixed) {
      // Pure struct fields need to be created along with their parent
      // structs.
      code += GenIndents(2) + "if self." + field_field + " is not None:";
      code += GenIndents(3) + field_field + " = self." + field_field +
              ".Pack(builder)";
    } else {
      // Tables need to be created before their parent structs are created.
      code_prefix += GenIndents(2) + "if self." + field_field + " is not None:";
      code_prefix += GenIndents(3) + field_field + " = self." + field_field +
                     ".Pack(builder)";
      code += GenIndents(2) + "if self." + field_field + " is not None:";
    }

    code += GenIndents(3) + struct_type + "Add" + field_method + "(builder, " +
            field_field + ")";
  }